

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_gather_sampler_2d_array
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  string shaderSource_00;
  string shaderSource_01;
  string shaderSource_02;
  string shaderSource_03;
  string shaderSource_04;
  string shaderSource_05;
  string shaderSource_06;
  string shaderSource_07;
  string shaderSource_08;
  string shaderSource_09;
  string shaderSource_10;
  bool bVar1;
  char *__s;
  long *plVar2;
  size_type *psVar3;
  long lVar4;
  string shaderSource;
  _Alloc_hider _Var5;
  size_type sVar6;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 uVar7;
  undefined8 in_stack_fffffffffffffe40;
  allocator<char> local_1b1;
  long *local_1b0 [2];
  long local_1a0 [2];
  long *local_190 [2];
  long local_180 [2];
  long *local_170 [2];
  long local_160 [2];
  long *local_150 [2];
  long local_140 [2];
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  _Var5._M_p = &stack0xfffffffffffffe38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe28,"textureGrad - sampler2DArray","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffe28);
  if (_Var5._M_p != &stack0xfffffffffffffe38) {
    operator_delete(_Var5._M_p,in_stack_fffffffffffffe38 + 1);
  }
  lVar4 = 0;
  do {
    shaderType = *(ShaderType *)
                  ((long)&NegativeTestShared::(anonymous_namespace)::s_shaders + lVar4);
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_1b1);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1c82f43);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)*plVar2 == psVar3) {
        uVar7 = *psVar3;
        in_stack_fffffffffffffe40 = plVar2[3];
        _Var5._M_p = &stack0xfffffffffffffe38;
      }
      else {
        uVar7 = *psVar3;
        _Var5._M_p = (pointer)*plVar2;
      }
      sVar6 = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffffe28);
      if (_Var5._M_p != &stack0xfffffffffffffe38) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x2b,TYPE_FLOAT,TYPE_LAST,
                 (DataType)_Var5._M_p);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>((string *)local_70,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_00._M_string_length = sVar6;
      shaderSource_00._M_dataplus._M_p = _Var5._M_p;
      shaderSource_00.field_2._M_allocated_capacity = uVar7;
      shaderSource_00.field_2._8_8_ = in_stack_fffffffffffffe40;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_70[0],shaderSource_00);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if (_Var5._M_p != &stack0xfffffffffffffe38) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x2b,TYPE_FLOAT_VEC3,TYPE_FLOAT,
                 (DataType)_Var5._M_p);
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>((string *)local_90,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_01._M_string_length = sVar6;
      shaderSource_01._M_dataplus._M_p = _Var5._M_p;
      shaderSource_01.field_2._M_allocated_capacity = uVar7;
      shaderSource_01.field_2._8_8_ = in_stack_fffffffffffffe40;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_90[0],shaderSource_01);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      if (_Var5._M_p != &stack0xfffffffffffffe38) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x2b,TYPE_FLOAT,TYPE_INT,
                 (DataType)_Var5._M_p);
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char*>((string *)local_b0,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_02._M_string_length = sVar6;
      shaderSource_02._M_dataplus._M_p = _Var5._M_p;
      shaderSource_02.field_2._M_allocated_capacity = uVar7;
      shaderSource_02.field_2._8_8_ = in_stack_fffffffffffffe40;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_b0[0],shaderSource_02);
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      if (_Var5._M_p != &stack0xfffffffffffffe38) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x38,TYPE_FLOAT,TYPE_LAST,
                 (DataType)_Var5._M_p);
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char*>((string *)local_d0,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_03._M_string_length = sVar6;
      shaderSource_03._M_dataplus._M_p = _Var5._M_p;
      shaderSource_03.field_2._M_allocated_capacity = uVar7;
      shaderSource_03.field_2._8_8_ = in_stack_fffffffffffffe40;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_d0[0],shaderSource_03);
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0],local_c0[0] + 1);
      }
      if (_Var5._M_p != &stack0xfffffffffffffe38) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x38,TYPE_FLOAT_VEC3,TYPE_FLOAT,
                 (DataType)_Var5._M_p);
      local_f0[0] = local_e0;
      std::__cxx11::string::_M_construct<char*>((string *)local_f0,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_04._M_string_length = sVar6;
      shaderSource_04._M_dataplus._M_p = _Var5._M_p;
      shaderSource_04.field_2._M_allocated_capacity = uVar7;
      shaderSource_04.field_2._8_8_ = in_stack_fffffffffffffe40;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_f0[0],shaderSource_04);
      if (local_f0[0] != local_e0) {
        operator_delete(local_f0[0],local_e0[0] + 1);
      }
      if (_Var5._M_p != &stack0xfffffffffffffe38) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x38,TYPE_FLOAT,TYPE_INT,
                 (DataType)_Var5._M_p);
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char*>((string *)local_110,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_05._M_string_length = sVar6;
      shaderSource_05._M_dataplus._M_p = _Var5._M_p;
      shaderSource_05.field_2._M_allocated_capacity = uVar7;
      shaderSource_05.field_2._8_8_ = in_stack_fffffffffffffe40;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_110[0],shaderSource_05);
      if (local_110[0] != local_100) {
        operator_delete(local_110[0],local_100[0] + 1);
      }
      if (_Var5._M_p != &stack0xfffffffffffffe38) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x3f,TYPE_FLOAT,TYPE_LAST,
                 (DataType)_Var5._M_p);
      local_130[0] = local_120;
      std::__cxx11::string::_M_construct<char*>((string *)local_130,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_06._M_string_length = sVar6;
      shaderSource_06._M_dataplus._M_p = _Var5._M_p;
      shaderSource_06.field_2._M_allocated_capacity = uVar7;
      shaderSource_06.field_2._8_8_ = in_stack_fffffffffffffe40;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_130[0],shaderSource_06);
      if (local_130[0] != local_120) {
        operator_delete(local_130[0],local_120[0] + 1);
      }
      if (_Var5._M_p != &stack0xfffffffffffffe38) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x3f,TYPE_FLOAT_VEC3,TYPE_FLOAT,
                 (DataType)_Var5._M_p);
      local_150[0] = local_140;
      std::__cxx11::string::_M_construct<char*>((string *)local_150,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_07._M_string_length = sVar6;
      shaderSource_07._M_dataplus._M_p = _Var5._M_p;
      shaderSource_07.field_2._M_allocated_capacity = uVar7;
      shaderSource_07.field_2._8_8_ = in_stack_fffffffffffffe40;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_150[0],shaderSource_07);
      if (local_150[0] != local_140) {
        operator_delete(local_150[0],local_140[0] + 1);
      }
      if (_Var5._M_p != &stack0xfffffffffffffe38) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x3f,TYPE_FLOAT,TYPE_INT,
                 (DataType)_Var5._M_p);
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char*>((string *)local_170,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_08._M_string_length = sVar6;
      shaderSource_08._M_dataplus._M_p = _Var5._M_p;
      shaderSource_08.field_2._M_allocated_capacity = uVar7;
      shaderSource_08.field_2._8_8_ = in_stack_fffffffffffffe40;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_170[0],shaderSource_08);
      if (local_170[0] != local_160) {
        operator_delete(local_170[0],local_160[0] + 1);
      }
      if (_Var5._M_p != &stack0xfffffffffffffe38) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x40,TYPE_FLOAT_VEC3,TYPE_LAST,
                 (DataType)_Var5._M_p);
      local_190[0] = local_180;
      std::__cxx11::string::_M_construct<char*>((string *)local_190,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_09._M_string_length = sVar6;
      shaderSource_09._M_dataplus._M_p = _Var5._M_p;
      shaderSource_09.field_2._M_allocated_capacity = uVar7;
      shaderSource_09.field_2._8_8_ = in_stack_fffffffffffffe40;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_190[0],shaderSource_09);
      if (local_190[0] != local_180) {
        operator_delete(local_190[0],local_180[0] + 1);
      }
      if (_Var5._M_p != &stack0xfffffffffffffe38) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGather_abi_cxx11_
                ((string *)&stack0xfffffffffffffe28,(_anonymous_namespace_ *)ctx,
                 (NegativeTestContext *)(ulong)shaderType,0x40,TYPE_FLOAT_VEC3,TYPE_INT,
                 (DataType)_Var5._M_p);
      local_1b0[0] = local_1a0;
      std::__cxx11::string::_M_construct<char*>((string *)local_1b0,_Var5._M_p,_Var5._M_p + sVar6);
      shaderSource_10._M_string_length = sVar6;
      shaderSource_10._M_dataplus._M_p = _Var5._M_p;
      shaderSource_10.field_2._M_allocated_capacity = uVar7;
      shaderSource_10.field_2._8_8_ = in_stack_fffffffffffffe40;
      verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   (ShaderType)local_1b0[0],shaderSource_10);
      if (local_1b0[0] != local_1a0) {
        operator_delete(local_1b0[0],local_1a0[0] + 1);
      }
      if (_Var5._M_p != &stack0xfffffffffffffe38) {
        operator_delete(_Var5._M_p,uVar7 + 1);
      }
      NegativeTestContext::endSection(ctx);
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x18);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texture_gather_sampler_2d_array (NegativeTestContext& ctx)
{
	ctx.beginSection("textureGrad - sampler2DArray");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGather(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}